

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

void rw::ps2::allocateADC(Geometry *geo)

{
  uint32 uVar1;
  void *__s;
  ulong __n;
  long lVar2;
  
  lVar2 = (long)adcOffset;
  *(undefined4 *)((long)geo->texCoords + lVar2 + -0x38) = 1;
  uVar1 = geo->meshHeader->totalIndices;
  *(uint32 *)((long)geo->texCoords + lVar2 + -0x28) = uVar1;
  __n = (long)(int)uVar1 + 3U & 0xfffffffffffffffc;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 1224"
  ;
  __s = (void *)(*DAT_00149de8)(__n);
  *(void **)((long)geo->texCoords + lVar2 + -0x30) = __s;
  memset(__s,0,__n);
  return;
}

Assistant:

void
allocateADC(Geometry *geo)
{
	ADCData *adc = PLUGINOFFSET(ADCData, geo, adcOffset);
	adc->adcFormatted = 1;
	adc->numBits = geo->meshHeader->totalIndices;
	int32 size = adc->numBits+3 & ~3;
	adc->adcBits = rwNewT(int8, size, MEMDUR_EVENT | ID_ADC);
	memset(adc->adcBits, 0, size);
}